

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::init(QueryCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined7 extraout_var;
  ContextInfo *this_00;
  undefined7 extraout_var_00;
  NotSupportedError *this_01;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  undefined1 local_11;
  QueryCase *pQStack_10;
  bool supportsES32;
  QueryCase *this_local;
  
  pQStack_10 = this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  iVar2 = (int)CONCAT71(extraout_var,local_11);
  if (!(bool)local_11) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_primitive_bounding_box");
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_41);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return iVar2;
}

Assistant:

void QueryCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
}